

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamWriter::writeTextElement
          (QXmlStreamWriter *this,QAnyStringView namespaceUri,QAnyStringView name,
          QAnyStringView text)

{
  writeStartElement(this,namespaceUri,name);
  writeCharacters(this,text);
  writeEndElement(this);
  return;
}

Assistant:

void QXmlStreamWriter::writeTextElement(QAnyStringView namespaceUri, QAnyStringView name, QAnyStringView text)
{
    writeStartElement(namespaceUri, name);
    writeCharacters(text);
    writeEndElement();
}